

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

bool __thiscall
crnlib::qdxt5::pack(qdxt5 *this,dxt5_block *pDst_elements,uint elements_per_block,
                   qdxt5_params *params)

{
  bool bVar1;
  uint uVar2;
  uint value;
  uint uVar3;
  crn_thread_id_t cVar4;
  vector<unsigned_int> *pvVar5;
  uint *puVar6;
  undefined4 uVar7;
  uint *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  float __x;
  float fVar8;
  float fVar9;
  uint i_3;
  optimize_selectors_params optimize_selectors_task_params;
  uint i_2;
  vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices;
  uint num;
  uint i_1;
  uint max_blocks;
  uint i;
  uint max_selector_clusters;
  uint max_endpoint_clusters;
  float selector_quality;
  float endpoint_quality;
  float quality;
  vector<crnlib::vector<unsigned_int>_> *in_stack_00000208;
  uint in_stack_00000214;
  qdxt5 *in_stack_00000218;
  uint in_stack_ffffffffffffff54;
  undefined8 *puVar10;
  undefined4 in_stack_ffffffffffffff60;
  code *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar11;
  optimize_selectors_params in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar12;
  undefined8 in_stack_ffffffffffffffa8;
  vector<crnlib::vector<unsigned_int>_> *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_48;
  uint local_44;
  uint local_40;
  bool local_1;
  
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  cVar4 = crn_get_current_thread_id();
  in_RDI[1] = cVar4;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[5] = in_RSI;
  *(undefined4 *)(in_RDI + 6) = in_EDX;
  memcpy(in_RDI + 7,in_RCX,0x62d);
  *(undefined4 *)((long)in_RDI + 0x66c) = 0xffffffff;
  __x = (float)*(uint *)(in_RDI + 7) / 255.0;
  fVar8 = powf(__x,2.1);
  fVar9 = powf(__x,1.65);
  puVar10 = in_RDI + 0xce;
  uVar2 = clusterizer<crnlib::vec<2U,_float>_>::get_codebook_size
                    ((clusterizer<crnlib::vec<2U,_float>_> *)0x18e4e1);
  value = (uint)(long)((float)uVar2 * fVar8);
  uVar2 = clusterizer<crnlib::vec<2U,_float>_>::get_codebook_size
                    ((clusterizer<crnlib::vec<2U,_float>_> *)0x18e508);
  math::clamp<unsigned_int>(value,0x10,uVar2);
  math::clamp<unsigned_int>
            ((uint)(long)((float)*(uint *)(in_RDI + 0xcd) * fVar9),0x20,*(uint *)(in_RDI + 0xcd));
  if (__x < 1.0) {
    clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
              ((clusterizer<crnlib::vec<2U,_float>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),uVar3,
               (vector<crnlib::vector<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  else {
    vector<crnlib::vector<unsigned_int>_>::resize
              ((vector<crnlib::vector<unsigned_int>_> *)CONCAT44(value,in_stack_ffffffffffffff60),
               (uint)((ulong)puVar10 >> 0x20),SUB81((ulong)puVar10 >> 0x18,0));
    for (local_40 = 0; local_40 < *(uint *)((long)in_RDI + 0x1c); local_40 = local_40 + 1) {
      vector<crnlib::vector<unsigned_int>_>::operator[]
                ((vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0xdc),local_40);
      vector<unsigned_int>::resize
                ((vector<unsigned_int> *)CONCAT44(value,in_stack_ffffffffffffff60),
                 (uint)((ulong)puVar10 >> 0x20),SUB81((ulong)puVar10 >> 0x18,0));
      in_stack_ffffffffffffff54 = local_40;
      pvVar5 = vector<crnlib::vector<unsigned_int>_>::operator[]
                         ((vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0xdc),local_40);
      puVar6 = vector<unsigned_int>::operator[](pvVar5,0);
      *puVar6 = in_stack_ffffffffffffff54;
    }
  }
  local_44 = 0;
  local_48 = 0;
  while (uVar2 = local_48,
        uVar3 = vector<crnlib::vector<unsigned_int>_>::size
                          ((vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0xdc)), uVar2 < uVar3)
  {
    pvVar5 = vector<crnlib::vector<unsigned_int>_>::operator[]
                       ((vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0xdc),local_48);
    uVar2 = vector<unsigned_int>::size(pvVar5);
    local_44 = math::maximum<unsigned_int>(local_44,uVar2);
    local_48 = local_48 + 1;
  }
  this_00 = (vector<crnlib::vector<unsigned_int>_> *)(in_RDI + (ulong)*in_RCX * 2 + 0x11c);
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  if (__x < 1.0) {
    bVar1 = vector<crnlib::vector<unsigned_int>_>::empty(this_00);
    if (bVar1) {
      uVar7 = 0x21;
      if (*(int *)((long)in_RDI + 0x3c) == 0) {
        uVar7 = 10;
      }
      *(undefined4 *)(in_RDI + 3) = uVar7;
    }
    else {
      uVar7 = 0x32;
      if (*(int *)((long)in_RDI + 0x3c) == 0) {
        uVar7 = 10;
      }
      *(undefined4 *)(in_RDI + 3) = uVar7;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 3) = 100;
  }
  uVar12 = 0;
  while (uVar11 = uVar12, uVar3 = task_pool::get_num_threads((task_pool *)*in_RDI), uVar12 <= uVar3)
  {
    task_pool::queue_object_task<crnlib::qdxt5,void(crnlib::qdxt5::*)(unsigned_long_long,void*)>
              ((task_pool *)in_stack_ffffffffffffff88.m_selector_cluster_indices,
               (qdxt5 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (offset_in_qdxt5_to_subr)in_stack_ffffffffffffff70,(uint64)in_RDI,
               (void *)CONCAT44(value,in_stack_ffffffffffffff60));
    uVar12 = uVar11 + 1;
  }
  task_pool::join((task_pool *)in_stack_ffffffffffffff70);
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    if (__x < 1.0) {
      bVar1 = vector<crnlib::vector<unsigned_int>_>::empty(this_00);
      if ((bVar1) &&
         (create_selector_clusters(in_stack_00000218,in_stack_00000214,in_stack_00000208),
         (*(byte *)(in_RDI + 2) & 1) != 0)) {
        vector<crnlib::vector<unsigned_int>_>::clear
                  ((vector<crnlib::vector<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,uVar2));
        local_1 = false;
      }
      else {
        *(int *)((long)in_RDI + 0x14) = *(int *)(in_RDI + 3) + *(int *)((long)in_RDI + 0x14);
        *(int *)(in_RDI + 3) = 100 - *(int *)((long)in_RDI + 0x14);
        optimize_selectors_params::optimize_selectors_params
                  ((optimize_selectors_params *)&stack0xffffffffffffff88,this_00);
        uVar12 = 0;
        while (uVar11 = uVar12, uVar2 = task_pool::get_num_threads((task_pool *)*in_RDI),
              uVar12 <= uVar2) {
          in_stack_ffffffffffffff70 = optimize_selectors_task;
          task_pool::
          queue_object_task<crnlib::qdxt5,void(crnlib::qdxt5::*)(unsigned_long_long,void*)>
                    ((task_pool *)in_stack_ffffffffffffff88.m_selector_cluster_indices,
                     (qdxt5 *)CONCAT44(uVar11,in_stack_ffffffffffffff80),0x18cf20,(uint64)in_RDI,
                     (void *)CONCAT44(value,in_stack_ffffffffffffff60));
          uVar12 = uVar11 + 1;
        }
        task_pool::join((task_pool *)in_stack_ffffffffffffff70);
        local_1 = (bool)((*(byte *)(in_RDI + 2) ^ 0xff) & 1);
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool qdxt5::pack(dxt5_block* pDst_elements, uint elements_per_block, const qdxt5_params& params) {
  CRNLIB_ASSERT(m_num_blocks);

  m_main_thread_id = crn_get_current_thread_id();
  m_canceled = false;

  m_pDst_elements = pDst_elements;
  m_elements_per_block = elements_per_block;
  m_params = params;

  m_prev_percentage_complete = -1;

  CRNLIB_ASSERT(m_params.m_quality_level <= qdxt5_params::cMaxQuality);
  const float quality = m_params.m_quality_level / (float)qdxt5_params::cMaxQuality;
  const float endpoint_quality = powf(quality, 2.1f);
  const float selector_quality = powf(quality, 1.65f);

  const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 16U, m_endpoint_clusterizer.get_codebook_size());
  const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 32U, m_max_selector_clusters);

#if QDXT5_DEBUGGING
  trace("max endpoint clusters: %u\n", max_endpoint_clusters);
  trace("max selector clusters: %u\n", max_selector_clusters);
#endif

  if (quality >= 1.0f) {
    m_endpoint_cluster_indices.resize(m_num_blocks);
    for (uint i = 0; i < m_num_blocks; i++) {
      m_endpoint_cluster_indices[i].resize(1);
      m_endpoint_cluster_indices[i][0] = i;
    }
  } else
    m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);

  uint max_blocks = 0;
  for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++) {
    uint num = m_endpoint_cluster_indices[i].size();
    max_blocks = math::maximum(max_blocks, num);
  }

  crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

  m_progress_start = 0;
  if (quality >= 1.0f)
    m_progress_range = 100;
  else if (selector_cluster_indices.empty())
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
  else
    m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::pack_endpoints_task, i);
  m_pTask_pool->join();

  if (m_canceled)
    return false;

  if (quality >= 1.0f)
    return true;

  if (selector_cluster_indices.empty()) {
    create_selector_clusters(max_selector_clusters, selector_cluster_indices);

    if (m_canceled) {
      selector_cluster_indices.clear();

      return false;
    }
  }

  m_progress_start += m_progress_range;
  m_progress_range = 100 - m_progress_start;

  optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, &qdxt5::optimize_selectors_task, i, &optimize_selectors_task_params);

  m_pTask_pool->join();

  return !m_canceled;
}